

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator=(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *old)

{
  cpp_dec_float<100U,_int,_void> local_78;
  
  if ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != old) {
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)this,&old->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               );
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 200),
                &old->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               );
    *(uint *)(this + 400) = (uint)(old->thesense != MINIMIZE) * 2 + -1;
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 0x10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems[6] = 0;
    local_78.data._M_elems[7] = 0;
    local_78.data._M_elems[8] = 0;
    local_78.data._M_elems[9] = 0;
    local_78.data._M_elems[10] = 0;
    local_78.data._M_elems[0xb] = 0;
    local_78.data._M_elems[0xc] = 0;
    local_78.data._M_elems[0xd] = 0;
    local_78.data._M_elems._56_5_ = 0;
    local_78.data._M_elems[0xf]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              (&local_78,&(old->offset).m_backend);
    *(undefined8 *)(this + 0x1c4) = local_78.data._M_elems._48_8_;
    *(ulong *)(this + 0x1cc) =
         CONCAT35(local_78.data._M_elems[0xf]._1_3_,local_78.data._M_elems._56_5_);
    *(undefined8 *)(this + 0x1b4) = local_78.data._M_elems._32_8_;
    *(undefined8 *)(this + 0x1bc) = local_78.data._M_elems._40_8_;
    *(undefined8 *)(this + 0x1a4) = local_78.data._M_elems._16_8_;
    *(undefined8 *)(this + 0x1ac) = local_78.data._M_elems._24_8_;
    *(undefined8 *)(this + 0x194) = local_78.data._M_elems._0_8_;
    *(undefined8 *)(this + 0x19c) = local_78.data._M_elems._8_8_;
    *(int *)(this + 0x1d4) = local_78.exp;
    this[0x1d8] = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )local_78.neg;
    *(undefined8 *)(this + 0x1dc) = local_78._72_8_;
    this[0x1e4] = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )old->_isScaled;
    *(element_type **)(this + 0x1f8) =
         (old->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x200),
               &(old->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    *(undefined8 *)(this + 0x1e8) = 0;
    *(SPxOut **)(this + 0x1f0) = old->spxout;
  }
  return (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

SPxLPBase<R>& operator=(const SPxLPBase<S>& old)
   {
      if(this != (const SPxLPBase<R>*)(&old))
      {
         // The value of old.lp_scaler has to be nullptr
         // Refer to issue #161 in soplex gitlab
         assert(old.lp_scaler == nullptr);

         LPRowSetBase<R>::operator=(old);
         LPColSetBase<R>::operator=(old);
         thesense = (old.thesense) == SPxLPBase<S>::MINIMIZE ? SPxLPBase<R>::MINIMIZE :
                    SPxLPBase<R>::MAXIMIZE;
         offset = R(old.offset);
         _isScaled = old._isScaled;
         _tolerances = old._tolerances;

         // this may have un-intended consequences in the future
         lp_scaler = nullptr;
         spxout = old.spxout;

         assert(isConsistent());
      }

      return *this;
   }